

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O3

void * PaUtil_GroupAllocateMemory(PaUtilAllocationGroup *group,long size)

{
  PaUtilAllocationGroupLink *pPVar1;
  void *pvVar2;
  PaUtilAllocationGroupLink *in_RDX;
  
  if (group->spareLinks == (PaUtilAllocationGroupLink *)0x0) {
    pPVar1 = AllocateLinks(group->linkCount,group->linkBlocks,in_RDX);
    if (pPVar1 == (PaUtilAllocationGroupLink *)0x0) {
      if (group->spareLinks == (PaUtilAllocationGroupLink *)0x0) {
        return (void *)0x0;
      }
    }
    else {
      group->linkCount = group->linkCount << 1;
      group->linkBlocks = pPVar1;
      group->spareLinks = pPVar1 + 1;
    }
  }
  pvVar2 = PaUtil_AllocateMemory(size);
  if (pvVar2 == (void *)0x0) {
    return (void *)0x0;
  }
  pPVar1 = group->spareLinks;
  group->spareLinks = pPVar1->next;
  pPVar1->buffer = pvVar2;
  pPVar1->next = group->allocations;
  group->allocations = pPVar1;
  return pvVar2;
}

Assistant:

void* PaUtil_GroupAllocateMemory( PaUtilAllocationGroup* group, long size )
{
    struct PaUtilAllocationGroupLink *links, *link;
    void *result = 0;
    
    /* allocate more links if necessary */
    if( !group->spareLinks )
    {
        /* double the link count on each block allocation */
        links = AllocateLinks( group->linkCount, group->linkBlocks, group->spareLinks );
        if( links )
        {
            group->linkCount += group->linkCount;
            group->linkBlocks = &links[0];
            group->spareLinks = &links[1];
        }
    }

    if( group->spareLinks )
    {
        result = PaUtil_AllocateMemory( size );
        if( result )
        {
            link = group->spareLinks;
            group->spareLinks = link->next;

            link->buffer = result;
            link->next = group->allocations;

            group->allocations = link;
        }
    }

    return result;    
}